

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DefinitionIntroduction.cpp
# Opt level: O3

Term * __thiscall
Inferences::DefinitionIntroduction::lgg(DefinitionIntroduction *this,Term *left,Term *right)

{
  int *piVar1;
  int iVar2;
  TermList TVar3;
  TermList TVar4;
  ulong uVar5;
  undefined8 uVar6;
  bool bVar7;
  long lVar8;
  Entry *pEVar9;
  Term *pTVar10;
  long lVar11;
  uint uVar12;
  uint val;
  pair<Kernel::TermList,_Kernel::TermList> key;
  SubtermIterator local_98;
  Term *local_70;
  pair<Kernel::TermList,_Kernel::TermList> local_68;
  SubtermIterator local_58;
  
  local_70 = left;
  Kernel::SubtermIterator::SubtermIterator(&local_58,left);
  Kernel::SubtermIterator::SubtermIterator(&local_98,right);
  val = 0;
LAB_004bc626:
  bVar7 = Kernel::SubtermIterator::hasNext(&local_58);
  if (!bVar7) {
    pTVar10 = Kernel::Term::create
                        (local_70->_functor,*(uint *)&local_70->field_0xc & 0xfffffff,
                         (TermList *)Inferences::args._8_8_);
    Inferences::args._16_8_ = Inferences::args._8_8_;
    Lib::
    DHMap<std::pair<Kernel::TermList,_Kernel::TermList>,_unsigned_int,_Lib::DefaultHash,_Lib::DefaultHash2>
    ::reset((DHMap<std::pair<Kernel::TermList,_Kernel::TermList>,_unsigned_int,_Lib::DefaultHash,_Lib::DefaultHash2>
             *)substitution);
    local_98.super_IteratorCore<Kernel::TermList>._vptr_IteratorCore =
         (_func_int **)&PTR__SubtermIterator_00b3d8d0;
    Lib::Recycled<Lib::Stack<const_Kernel::TermList_*>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
    ::~Recycled(&local_98._stack);
    local_58.super_IteratorCore<Kernel::TermList>._vptr_IteratorCore =
         (_func_int **)&PTR__SubtermIterator_00b3d8d0;
    Lib::Recycled<Lib::Stack<const_Kernel::TermList_*>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
    ::~Recycled(&local_58._stack);
    return pTVar10;
  }
  Kernel::SubtermIterator::hasNext(&local_98);
  local_58._used = true;
  TVar3._content =
       (*(TermList ***)
         ((long)local_58._stack._self._M_t.
                super___uniq_ptr_impl<Lib::Stack<const_Kernel::TermList_*>,_std::default_delete<Lib::Stack<const_Kernel::TermList_*>_>_>
                ._M_t.
                super__Tuple_impl<0UL,_Lib::Stack<const_Kernel::TermList_*>_*,_std::default_delete<Lib::Stack<const_Kernel::TermList_*>_>_>
                .super__Head_base<0UL,_Lib::Stack<const_Kernel::TermList_*>_*,_false>._M_head_impl +
         0x10))[-1]->_content;
  local_98._used = true;
  TVar4._content =
       (*(TermList ***)
         ((long)local_98._stack._self._M_t.
                super___uniq_ptr_impl<Lib::Stack<const_Kernel::TermList_*>,_std::default_delete<Lib::Stack<const_Kernel::TermList_*>_>_>
                ._M_t.
                super__Tuple_impl<0UL,_Lib::Stack<const_Kernel::TermList_*>_*,_std::default_delete<Lib::Stack<const_Kernel::TermList_*>_>_>
                .super__Head_base<0UL,_Lib::Stack<const_Kernel::TermList_*>_*,_false>._M_head_impl +
         0x10))[-1]->_content;
  if (((((uint)TVar4._content | (uint)TVar3._content) & 3) != 0) ||
     (iVar2 = *(int *)(TVar3._content + 8), iVar2 != *(int *)(TVar4._content + 8)))
  goto LAB_004bc6d5;
  uVar12 = *(uint *)(TVar3._content + 0xc);
  if (functions._16_8_ == functions._24_8_) {
    Lib::Stack<Inferences::IncompleteFunction>::expand
              ((Stack<Inferences::IncompleteFunction> *)functions);
  }
  uVar6 = functions._16_8_;
  *(ulong *)functions._16_8_ = CONCAT44(uVar12,iVar2) & 0xfffffffffffffff;
  *(uint *)(uVar6 + 8) = uVar12 & 0xfffffff;
  lVar8 = functions._16_8_ + 0xc;
  lVar11 = functions._8_8_;
  functions._16_8_ = lVar8;
  goto LAB_004bc77c;
LAB_004bc6d5:
  local_68.first._content = TVar3._content;
  local_68.second._content = TVar4._content;
  pEVar9 = Lib::
           DHMap<std::pair<Kernel::TermList,_Kernel::TermList>,_unsigned_int,_Lib::DefaultHash,_Lib::DefaultHash2>
           ::findEntry((DHMap<std::pair<Kernel::TermList,_Kernel::TermList>,_unsigned_int,_Lib::DefaultHash,_Lib::DefaultHash2>
                        *)substitution,&local_68);
  if (pEVar9 == (Entry *)0x0) {
    key.second._content = TVar4._content;
    key.first._content = TVar3._content;
    Lib::
    DHMap<std::pair<Kernel::TermList,_Kernel::TermList>,_unsigned_int,_Lib::DefaultHash,_Lib::DefaultHash2>
    ::insert((DHMap<std::pair<Kernel::TermList,_Kernel::TermList>,_unsigned_int,_Lib::DefaultHash,_Lib::DefaultHash2>
              *)substitution,key,val);
    uVar12 = val;
    val = val + 1;
  }
  else {
    uVar12 = pEVar9->_val;
  }
  if (Inferences::args._16_8_ == Inferences::args._24_8_) {
    Lib::Stack<Kernel::TermList>::expand((Stack<Kernel::TermList> *)Inferences::args);
  }
  *(ulong *)Inferences::args._16_8_ = (ulong)(uVar12 * 4 + 1);
  Inferences::args._16_8_ = Inferences::args._16_8_ + 8;
  Kernel::SubtermIterator::right(&local_58);
  Kernel::SubtermIterator::right(&local_98);
  lVar8 = functions._16_8_;
  lVar11 = functions._8_8_;
  if (functions._16_8_ != functions._8_8_) {
    *(int *)(functions._16_8_ + -4) = *(int *)(functions._16_8_ + -4) + -1;
LAB_004bc77c:
    if (lVar8 != lVar11) {
      iVar2 = *(int *)(lVar8 + -4);
      while (iVar2 == 0) {
        functions._16_8_ = lVar8 + -0xc;
        uVar5 = *(ulong *)(lVar8 + -0xc);
        pTVar10 = Kernel::Term::create
                            ((uint)uVar5,(uint)(uVar5 >> 0x20),
                             (TermList *)(Inferences::args._16_8_ + (uVar5 >> 0x20) * -8));
        Inferences::args._16_8_ =
             Inferences::args._8_8_ +
             (((ulong)(Inferences::args._16_8_ - Inferences::args._8_8_) >> 3) - (uVar5 >> 0x20)) *
             8;
        if (Inferences::args._16_8_ == Inferences::args._24_8_) {
          Lib::Stack<Kernel::TermList>::expand((Stack<Kernel::TermList> *)Inferences::args);
        }
        *(Term **)Inferences::args._16_8_ = pTVar10;
        lVar8 = functions._16_8_;
        Inferences::args._16_8_ = Inferences::args._16_8_ + 8;
        if (functions._16_8_ == functions._8_8_) break;
        piVar1 = (int *)(functions._16_8_ + -4);
        *piVar1 = *piVar1 + -1;
        iVar2 = *piVar1;
      }
    }
  }
  goto LAB_004bc626;
}

Assistant:

Term *DefinitionIntroduction::lgg(Term *left, Term *right) {
  ASS_EQ(left->functor(), right->functor())
  ASS_EQ(functions.length(), 0)
  ASS_EQ(args.length(), 0)

  unsigned fresh = 0;
  SubtermIterator left_it(left);
  SubtermIterator right_it(right);

  while(left_it.hasNext()) {
    ALWAYS(right_it.hasNext());
    TermList left_top = left_it.next();
    TermList right_top = right_it.next();

    if(left_top.isTerm() && right_top.isTerm() && left_top.term()->functor() == right_top.term()->functor()) {
      unsigned functor = left_top.term()->functor();
      unsigned arity = left_top.term()->arity();
      unsigned remaining = arity;
      functions.push({functor, arity, remaining});
    }
    else {
      unsigned mapped;
      if(!substitution.find({left_top, right_top}, mapped))
        substitution.insert({left_top, right_top}, mapped = fresh++);

      args.push(TermList(mapped, false));
      left_it.right();
      right_it.right();

      if(functions.isNonEmpty())
        functions.top().remaining--;
    }

    while(functions.isNonEmpty() && !functions.top().remaining) {
      IncompleteFunction record = functions.pop();
      Term *term = Term::create(record.functor, record.arity, args.end() - record.arity);
      args.truncate(args.length() - record.arity);
      args.push(TermList(term));

      if(functions.isNonEmpty())
        functions.top().remaining--;
      else
        break;
    }
  }

  ASS(functions.isEmpty());
  ASS_EQ(args.length(), left->arity());
  Term *term = Term::create(left->functor(), left->arity(), args.begin());

  args.reset();
  substitution.reset();
  return term;
}